

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::api::anon_unknown_1::GraphicsPipeline::create
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *param_3)

{
  Move<vk::Handle<(vk::HandleType)18>_> *pMVar1;
  Handle<(vk::HandleType)18> object;
  VkAllocationCallbacks *pVVar2;
  VkDevice pVVar3;
  Parameters *pPVar4;
  Checked<vk::Handle<(vk::HandleType)18>_> CVar5;
  Move<vk::Handle<(vk::HandleType)18>_> *extraout_RAX;
  VkResult result;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  scopedHandles;
  VkResult local_3c;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  local_38;
  
  pPVar4 = (Parameters *)operator_new(8);
  *(undefined8 *)pPVar4 = 0;
  local_3c = VK_NOT_READY;
  createMultiple(&local_38,env,res,pPVar4,
                 (vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                  *)(pPVar4 + 8),&local_3c);
  ::vk::checkResult(local_3c,"result",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiObjectManagementTests.cpp"
                    ,0x6c5);
  pMVar1 = (local_38.
            super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->m_ptr;
  object.m_internal =
       (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal;
  (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device = (VkDevice)0x0;
  (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal = 0;
  (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  CVar5 = ::vk::refdetails::check<vk::Handle<(vk::HandleType)18>>(object);
  pVVar2 = env->allocationCallbacks;
  (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal
       = (deUint64)CVar5.object.m_internal;
  pVVar3 = env->device;
  (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.
  m_deviceIface = env->vkd;
  (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device =
       pVVar3;
  (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.
  m_allocator = pVVar2;
  std::
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&local_38);
  operator_delete(pPVar4,8);
  return extraout_RAX;
}

Assistant:

static Move<VkPipeline> create (const Environment& env, const Resources& res, const Parameters&)
	{
		vector<VkPipeline>		handles			(1, DE_NULL);
		VkResult				result			= VK_NOT_READY;
		vector<VkPipelineSp>	scopedHandles	= createMultiple(env, res, Parameters(), &handles, &result);

		VK_CHECK(result);
		return Move<VkPipeline>(check<VkPipeline>(scopedHandles.front()->disown()), Deleter<VkPipeline>(env.vkd, env.device, env.allocationCallbacks));
	}